

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_variant.cc
# Opt level: O0

void __thiscall
variant_ctor_dtor_holding_C_Test::~variant_ctor_dtor_holding_C_Test
          (variant_ctor_dtor_holding_C_Test *this)

{
  variant_ctor_dtor_holding_C_Test *this_local;
  
  ~variant_ctor_dtor_holding_C_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(variant, ctor_dtor_holding_C) {
    static int ctor_count;
    static int dtor_count;

    class C {
      public:
        C() { ctor_count++; }
        ~C() { dtor_count++; }
    };

    {
        Variant<A, B, C> v{};
        EXPECT_EQ(ctor_count, 0);
        EXPECT_EQ(dtor_count, 0);

        v.emplace<C>();
        EXPECT_EQ(ctor_count, 1);
        EXPECT_EQ(dtor_count, 0);

        EXPECT_TRUE(v.holds<C>());
    }
    EXPECT_EQ(ctor_count, 1);
    EXPECT_EQ(dtor_count, 1);
}